

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<double>_> *this,TPZSkylMatrix<std::complex<double>_> *A)

{
  TPZSkylMatrix<std::complex<double>_> *in_RDI;
  TPZSkylMatrix<std::complex<double>_> *unaff_retaddr;
  int64_t in_stack_ffffffffffffffb8;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffffd0;
  TPZSkylMatrix<std::complex<double>_> *A_00;
  
  A_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylMatrix<std::complex<double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZMatrix<std::complex<double>_>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             &in_RDI->super_TPZMatrix<std::complex<double>_>);
  (in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_02414850;
  TPZVec<std::complex<double>_*>::TPZVec
            ((TPZVec<std::complex<double>_*> *)in_RDI,in_stack_ffffffffffffffb8);
  TPZVec<std::complex<double>_>::TPZVec
            ((TPZVec<std::complex<double>_> *)unaff_retaddr,(int64_t)A_00);
  Copy(unaff_retaddr,A_00);
  return;
}

Assistant:

TPZSkylMatrix(const TPZSkylMatrix<TVar> &A ) : TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fStorage(0)  { Copy(A); }